

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O2

void __thiscall OpenMD::RigidBody::setPrevA(RigidBody *this,RotMat3x3d *a)

{
  pointer ppAVar1;
  Atom *pAVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  SquareMatrix3<double> local_c0;
  SquareMatrix3<double> local_78;
  
  RectMatrix<double,_3U,_3U>::operator=
            ((RectMatrix<double,_3U,_3U> *)
             ((long)(this->super_StuntDouble).localIndex_ * 0x48 +
             *(long *)((long)&(((this->super_StuntDouble).snapshotMan_)->previousSnapshot_->atomData
                              ).aMat.
                              super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start +
                      (this->super_StuntDouble).storage_)),(RectMatrix<double,_3U,_3U> *)a);
  uVar4 = 0;
  while( true ) {
    uVar5 = (ulong)uVar4;
    ppAVar1 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->atoms_).
                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppAVar1 >> 3) <= uVar5) break;
    bVar3 = Atom::isDirectional(ppAVar1[uVar5]);
    if (bVar3) {
      pAVar2 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar5];
      SquareMatrix3<double>::transpose
                (&local_c0,
                 (this->refOrients_).
                 super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar5);
      operator*(&local_78,&local_c0,a);
      (*(pAVar2->super_StuntDouble)._vptr_StuntDouble[2])(pAVar2,&local_78);
    }
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

void RigidBody::setPrevA(const RotMat3x3d& a) {
    ((snapshotMan_->getPrevSnapshot())->*storage_).aMat[localIndex_] = a;

    for (unsigned int i = 0; i < atoms_.size(); ++i) {
      if (atoms_[i]->isDirectional()) {
        atoms_[i]->setPrevA(refOrients_[i].transpose() * a);
      }
    }
  }